

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O1

void basisu::compute_bc1_hints
               (bool *bc1_hint0,bool *bc1_hint1,uastc_encode_results *best_results,
               color_rgba (*block) [4],color_rgba (*decoded_uastc_block) [4])

{
  char cVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  uint8_t *puVar7;
  long lVar8;
  ulong uVar9;
  unpacked_uastc_block *puVar10;
  unpacked_uastc_block *puVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint8_t *puVar18;
  byte bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  dxt1_block b;
  eac_a8_block etc2_blk;
  etc_block etc1_blk;
  color_rgba tblock_hint1_bc1 [4] [4];
  color_rgba tblock_hint0_bc1 [4] [4];
  uastc_block temp_ublock;
  color_rgba tblock_bc1 [4] [4];
  dxt1_block tbc1_block [8];
  unpacked_uastc_block temp_ublock_unpacked;
  undefined1 local_290 [8];
  eac_a8_block local_288;
  anon_union_8_2_04352b30_for_etc_block_0 local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uastc_block local_1f8;
  color_rgba local_1e8 [18];
  unpacked_uastc_block local_1a0;
  undefined1 local_108 [64];
  unpacked_uastc_block local_c8;
  
  bVar19 = 0;
  uVar5 = (ulong)best_results->m_uastc_mode;
  *bc1_hint0 = false;
  *bc1_hint1 = false;
  if ((uVar5 != 8) &&
     ((cVar1 = basist::g_uastc_mode_has_bc1_hint0[uVar5], cVar1 != '\0' ||
      (basist::g_uastc_mode_has_bc1_hint1[uVar5] != '\0')))) {
    basist::encode_bc1(local_108,(uint8_t *)decoded_uastc_block,0);
    unpack_block(cBC1,local_108,local_1e8);
    local_280.m_uint64 = 0;
    local_288 = (eac_a8_block)0x1000;
    pack_uastc(&local_1f8,best_results,(etc_block *)&local_280,0,&local_288,false,false);
    basist::unpack_uastc(&local_1f8,&local_c8,false,true);
    memset(&local_1a0,0,0x98);
    local_1a0.m_mode = best_results->m_uastc_mode;
    local_1a0.m_common_pattern = best_results->m_common_pattern;
    puVar10 = &local_c8;
    puVar11 = &local_1a0;
    for (lVar6 = 0x1a; lVar6 != 0; lVar6 = lVar6 + -1) {
      (puVar11->m_astc).m_weight_range = (puVar10->m_astc).m_weight_range;
      puVar10 = (unpacked_uastc_block *)((long)puVar10 + (ulong)bVar19 * -8 + 4);
      puVar11 = (unpacked_uastc_block *)((long)puVar11 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    cVar2 = basist::g_uastc_mode_has_bc1_hint1[uVar5];
    if (cVar2 == '\0') {
      local_248 = 0;
      uStack_240 = 0;
      local_258 = 0;
      uStack_250 = 0;
      local_268 = 0;
      uStack_260 = 0;
      local_278 = 0;
      uStack_270 = 0;
    }
    else {
      basist::transcode_uastc_to_bc1_hint1
                (&local_1a0,(color32 (*) [4])decoded_uastc_block,local_290,false);
      unpack_block(cBC1,local_290,(color_rgba *)&local_278);
    }
    if (cVar1 == '\0') {
      local_208 = 0;
      uStack_200 = 0;
      local_218 = 0;
      uStack_210 = 0;
      local_228 = 0;
      uStack_220 = 0;
      local_238 = 0;
      uStack_230 = 0;
    }
    else {
      basist::transcode_uastc_to_bc1_hint0(&local_1a0,local_290);
      unpack_block(cBC1,local_290,(color_rgba *)&local_238);
    }
    puVar18 = (*block)[0].field_0.m_comps + 2;
    puVar7 = local_1e8[0].field_0.m_comps + 2;
    lVar8 = (long)&local_238 + 2;
    lVar6 = (long)&local_278 + 2;
    lVar12 = 0;
    uVar5 = 0;
    uVar15 = 0;
    uVar9 = 0;
    do {
      lVar13 = 0;
      do {
        bVar19 = puVar18[lVar13 + -2];
        bVar3 = puVar18[lVar13 + -1];
        bVar4 = puVar18[lVar13];
        iVar14 = (uint)bVar19 - (uint)puVar7[lVar13 + -2];
        iVar17 = (uint)bVar3 - (uint)puVar7[lVar13 + -1];
        iVar16 = (uint)bVar4 - (uint)puVar7[lVar13];
        uVar5 = uVar5 + (uint)(iVar16 * iVar16 + iVar17 * iVar17 + iVar14 * iVar14);
        iVar17 = (uint)bVar19 - (uint)*(byte *)(lVar8 + -2 + lVar13);
        iVar16 = (uint)bVar3 - (uint)*(byte *)(lVar8 + -1 + lVar13);
        iVar14 = (uint)bVar4 - (uint)*(byte *)(lVar8 + lVar13);
        uVar15 = uVar15 + (uint)(iVar14 * iVar14 + iVar16 * iVar16 + iVar17 * iVar17);
        iVar14 = (uint)bVar19 - (uint)*(byte *)(lVar6 + -2 + lVar13);
        iVar17 = (uint)bVar3 - (uint)*(byte *)(lVar6 + -1 + lVar13);
        iVar16 = (uint)bVar4 - (uint)*(byte *)(lVar6 + lVar13);
        uVar9 = uVar9 + (uint)(iVar16 * iVar16 + iVar17 * iVar17 + iVar14 * iVar14);
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x10);
      lVar12 = lVar12 + 1;
      puVar18 = puVar18 + 0x10;
      puVar7 = puVar7 + 0x10;
      lVar8 = lVar8 + 0x10;
      lVar6 = lVar6 + 0x10;
    } while (lVar12 != 4);
    fVar20 = (float)uVar5;
    if (fVar20 < 0.0) {
      fVar20 = sqrtf(fVar20);
    }
    else {
      fVar20 = SQRT(fVar20);
    }
    fVar22 = (float)uVar15;
    if (fVar22 < 0.0) {
      fVar22 = sqrtf(fVar22);
    }
    else {
      fVar22 = SQRT(fVar22);
    }
    fVar21 = (float)uVar9;
    if (fVar21 < 0.0) {
      fVar21 = sqrtf(fVar21);
    }
    else {
      fVar21 = SQRT(fVar21);
    }
    if ((cVar1 != '\0') && (fVar22 <= fVar20 * 1.075)) {
      *bc1_hint0 = true;
    }
    if ((cVar2 != '\0') && (fVar21 <= fVar20 * 1.075)) {
      *bc1_hint1 = true;
    }
  }
  return;
}

Assistant:

static void compute_bc1_hints(bool &bc1_hint0, bool &bc1_hint1, const uastc_encode_results &best_results, const color_rgba block[4][4], const color_rgba decoded_uastc_block[4][4])
	{
		const uint32_t best_mode = best_results.m_uastc_mode;
		const bool perceptual = false;

		bc1_hint0 = false;
		bc1_hint1 = false;

		if (best_mode == UASTC_MODE_INDEX_SOLID_COLOR)
			return;

		if (!g_uastc_mode_has_bc1_hint0[best_mode] && !g_uastc_mode_has_bc1_hint1[best_mode])
			return;

		color_rgba tblock_bc1[4][4];
		dxt1_block tbc1_block[8];
		basist::encode_bc1(tbc1_block, (const uint8_t*)&decoded_uastc_block[0][0], 0);
		unpack_block(texture_format::cBC1, tbc1_block, &tblock_bc1[0][0]);

		color_rgba tblock_hint0_bc1[4][4];
		color_rgba tblock_hint1_bc1[4][4];
		
		etc_block etc1_blk;
		memset(&etc1_blk, 0, sizeof(etc1_blk));

		eac_a8_block etc2_blk;
		memset(&etc2_blk, 0, sizeof(etc2_blk));
		etc2_blk.m_multiplier = 1;
		
		// Pack to UASTC, then unpack, because the endpoints may be swapped.

		uastc_block temp_ublock;
		pack_uastc(temp_ublock, best_results, etc1_blk, 0, etc2_blk, false, false);

		unpacked_uastc_block temp_ublock_unpacked;
		unpack_uastc(temp_ublock, temp_ublock_unpacked, false);
										
		unpacked_uastc_block ublock = {};
		ublock.m_mode = best_results.m_uastc_mode;
		ublock.m_common_pattern = best_results.m_common_pattern;
		ublock.m_astc = temp_ublock_unpacked.m_astc;

		dxt1_block b;

		// HINT1
		if (!g_uastc_mode_has_bc1_hint1[best_mode])
		{
			memset(tblock_hint1_bc1, 0, sizeof(tblock_hint1_bc1));
		}
		else
		{
			transcode_uastc_to_bc1_hint1(ublock, (color32 (*)[4]) decoded_uastc_block, &b, false);

			unpack_block(texture_format::cBC1, &b, &tblock_hint1_bc1[0][0]);
		}

		// HINT0
		if (!g_uastc_mode_has_bc1_hint0[best_mode])
		{
			memset(tblock_hint0_bc1, 0, sizeof(tblock_hint0_bc1));
		}
		else
		{
			transcode_uastc_to_bc1_hint0(ublock, &b);
			
			unpack_block(texture_format::cBC1, &b, &tblock_hint0_bc1[0][0]);
		}

		// Compute block errors
		uint64_t total_t_err = 0, total_hint0_err = 0, total_hint1_err = 0;
		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				total_t_err += color_distance(perceptual, block[y][x], tblock_bc1[y][x], false);
				total_hint0_err += color_distance(perceptual, block[y][x], tblock_hint0_bc1[y][x], false);
				total_hint1_err += color_distance(perceptual, block[y][x], tblock_hint1_bc1[y][x], false);
			}
		}

		const float t_err = sqrtf((float)total_t_err);
		const float t_err_hint0 = sqrtf((float)total_hint0_err);
		const float t_err_hint1 = sqrtf((float)total_hint1_err);

		const float err_thresh0 = 1.075f;
		const float err_thresh1 = 1.075f;
		
		if ((g_uastc_mode_has_bc1_hint0[best_mode]) && (t_err_hint0 <= t_err * err_thresh0))
			bc1_hint0 = true;

		if ((g_uastc_mode_has_bc1_hint1[best_mode]) && (t_err_hint1 <= t_err * err_thresh1))
			bc1_hint1 = true;
	}